

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O3

int luaH_getn(Table *t)

{
  uint uVar1;
  TValue *pTVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  uVar3 = t->sizearray;
  if ((uVar3 == 0) || (t->array[uVar3 - 1].tt_ != 0)) {
    uVar5 = uVar3;
    if (t->node != &dummynode_) {
      pTVar2 = luaH_getint(t,uVar3 + 1);
      iVar6 = pTVar2->tt_;
      uVar4 = uVar3 + 1;
      while (iVar6 != 0) {
        uVar5 = uVar4 * 2;
        if (0x7ffffffd < uVar5) {
          iVar6 = -1;
          do {
            pTVar2 = luaH_getint(t,iVar6 + 2);
            iVar6 = iVar6 + 1;
          } while (pTVar2->tt_ != 0);
          return iVar6;
        }
        pTVar2 = luaH_getint(t,uVar5);
        uVar3 = uVar4;
        uVar4 = uVar5;
        iVar6 = pTVar2->tt_;
      }
      uVar1 = uVar4 - uVar3;
      while (uVar5 = uVar3, 1 < uVar1) {
        uVar5 = uVar4 + uVar3 >> 1;
        pTVar2 = luaH_getint(t,uVar5);
        if (pTVar2->tt_ == 0) {
          uVar4 = uVar5;
          uVar5 = uVar3;
        }
        uVar3 = uVar5;
        uVar1 = uVar4 - uVar5;
      }
    }
  }
  else {
    uVar5 = 0;
    if (uVar3 != 1) {
      uVar5 = 0;
      do {
        uVar4 = uVar5 + uVar3 >> 1;
        if (t->array[uVar4 - 1].tt_ == 0) {
          uVar3 = uVar4;
          uVar4 = uVar5;
        }
        uVar5 = uVar4;
      } while (1 < uVar3 - uVar5);
    }
  }
  return uVar5;
}

Assistant:

int luaH_getn (Table *t) {
  unsigned int j = t->sizearray;
  if (j > 0 && ttisnil(&t->array[j - 1])) {
    /* there is a boundary in the array part: (binary) search for it */
    unsigned int i = 0;
    while (j - i > 1) {
      unsigned int m = (i+j)/2;
      if (ttisnil(&t->array[m - 1])) j = m;
      else i = m;
    }
    return i;
  }
  /* else must find a boundary in hash part */
  else if (isdummy(t->node))  /* hash part is empty? */
    return j;  /* that is easy... */
  else return unbound_search(t, j);
}